

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# store.c
# Opt level: O2

parser_error parse_town(parser *p)

{
  int *piVar1;
  level_map_conflict *plVar2;
  town *ptVar3;
  int iVar4;
  void *pvVar5;
  char *__s1;
  store *psVar6;
  char *pcVar7;
  long lVar8;
  level_map_conflict **pplVar9;
  long lVar10;
  
  pvVar5 = parser_priv(p);
  __s1 = parser_getstr(p,"name");
  pplVar9 = &maps;
  while (plVar2 = *pplVar9, plVar2 != (level_map_conflict *)0x0) {
    lVar8 = 0x20;
    for (lVar10 = 0; lVar10 < plVar2->num_towns; lVar10 = lVar10 + 1) {
      ptVar3 = plVar2->towns;
      iVar4 = strcmp(__s1,*(char **)((long)ptVar3 + lVar8 + -0x18));
      if (iVar4 == 0) {
        psVar6 = store_new(*(wchar_t *)((long)pvVar5 + 0x18));
        pcVar7 = string_make(*(char **)((long)pvVar5 + 0x20));
        psVar6->name = pcVar7;
        psVar6->next = *(store **)((long)ptVar3 + lVar8 + -8);
        *(store **)((long)ptVar3 + lVar8 + -8) = psVar6;
        piVar1 = (int *)((long)&ptVar3->index + lVar8);
        *piVar1 = *piVar1 + 1;
      }
      lVar8 = lVar8 + 0x28;
    }
    pplVar9 = &plVar2->next;
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_town(struct parser *p) {
	struct store *s = parser_priv(p);
	const char *name = parser_getstr(p, "name");
	int i;
	struct level_map *map = maps;
	while (map) {
		for (i = 0; i < map->num_towns; i++) {
			struct town *town = &map->towns[i];
			if (streq(name, town->code)) {
				/* Add a new store ready to fill up with details */
				struct store *new = store_new(s->sidx);
				new->name = string_make(s->name);
				new->next = town->stores;
				town->stores = new;
				town->num_stores++;
			}
		}
		map = map->next;
	}
	return PARSE_ERROR_NONE;
}